

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void __thiscall
Function_Pool::FunctionTask::ProjectionProfile
          (FunctionTask *this,Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
          bool horizontal,vector<unsigned_int,_std::allocator<unsigned_int>_> *projection)

{
  byte bVar1;
  FunctionTask *this_00;
  long in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  byte bStack0000000000000008;
  uint32_t in_stack_0000000c;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000014;
  Image *in_stack_00000018;
  undefined7 in_stack_00000020;
  undefined4 in_stack_ffffffffffffffb8;
  TaskName in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = bStack0000000000000008 & 1;
  FunctionPoolTask::_setup
            ((FunctionPoolTask *)CONCAT17(horizontal,in_stack_00000020),in_stack_00000018,
             in_stack_00000014,in_stack_00000010,in_stack_0000000c,_bStack0000000000000008);
  this_00 = (FunctionTask *)(in_RDI + 0xe0);
  std::
  unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
  operator->((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
              *)0x126844);
  AreaInfo::_size((AreaInfo *)0x12684c);
  OutputInfo::resize((OutputInfo *)this_00,
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  *(byte *)(in_RDI + 0xaa) = bVar1 & 1;
  _process(this_00,in_stack_ffffffffffffffbc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(in_R8D,in_R9D),
             CONCAT17(bVar1,in_stack_ffffffffffffffd8));
  OutputInfo::getProjection
            ((OutputInfo *)this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)image);
  return;
}

Assistant:

void ProjectionProfile( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, bool horizontal,
                                std::vector < uint32_t > & projection )
        {
            _setup( image, x, y, width, height );
            _dataOut.resize( _infoIn1->_size() );
            _dataIn.horizontalProjection = horizontal;
            _process( _ProjectionProfile );

            projection.resize( horizontal ? width : height );
            _dataOut.getProjection( projection );
        }